

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobjectcleanuphandler.cpp
# Opt level: O2

void __thiscall QObjectCleanupHandler::~QObjectCleanupHandler(QObjectCleanupHandler *this)

{
  *(undefined ***)this = &PTR_metaObject_00665df0;
  clear(this);
  QArrayDataPointer<QObject_*>::~QArrayDataPointer((QArrayDataPointer<QObject_*> *)(this + 0x10));
  QObject::~QObject((QObject *)this);
  return;
}

Assistant:

QObjectCleanupHandler::~QObjectCleanupHandler()
{
    clear();
}